

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_1::CapnpcCppMain::getTransitiveSuperclasses
          (CapnpcCppMain *this,InterfaceSchema schema,
          map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
          *map)

{
  uint *__return_storage_ptr__;
  bool bVar1;
  InterfaceSchema schema_00;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_InterfaceSchema>_>::value,_pair<iterator,_bool>_>
  _Var2;
  Iterator IVar3;
  InterfaceSchema sup;
  undefined1 local_f8 [8];
  Iterator __end3;
  undefined1 local_d8 [8];
  Iterator __begin3;
  SuperclassList *__range3;
  Reader local_78;
  uint64_t local_48;
  pair<unsigned_long,_capnp::InterfaceSchema> local_40;
  _Base_ptr local_30;
  undefined1 local_28;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *local_20;
  map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
  *map_local;
  CapnpcCppMain *this_local;
  InterfaceSchema schema_local;
  
  local_20 = map;
  map_local = (map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
               *)this;
  this_local = (CapnpcCppMain *)schema.super_Schema.raw;
  Schema::getProto(&local_78,(Schema *)&this_local);
  local_48 = capnp::schema::Node::Reader::getId(&local_78);
  local_40 = std::make_pair<unsigned_long,capnp::InterfaceSchema&>
                       (&local_48,(InterfaceSchema *)&this_local);
  _Var2 = std::
          map<unsigned_long,capnp::InterfaceSchema,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
          ::insert<std::pair<unsigned_long,capnp::InterfaceSchema>>
                    ((map<unsigned_long,capnp::InterfaceSchema,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::InterfaceSchema>>>
                      *)map,&local_40);
  local_30 = (_Base_ptr)_Var2.first._M_node;
  local_28 = _Var2.second;
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __return_storage_ptr__ = &__begin3.index;
    InterfaceSchema::getSuperclasses
              ((SuperclassList *)__return_storage_ptr__,(InterfaceSchema *)&this_local);
    IVar3 = InterfaceSchema::SuperclassList::begin((SuperclassList *)__return_storage_ptr__);
    __end3._8_8_ = IVar3.container;
    __begin3.container._0_4_ = IVar3.index;
    local_d8 = (undefined1  [8])__end3._8_8_;
    IVar3 = InterfaceSchema::SuperclassList::end((SuperclassList *)__return_storage_ptr__);
    local_f8 = (undefined1  [8])IVar3.container;
    __end3.container._0_4_ = IVar3.index;
    while (bVar1 = _::
                   IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                   ::operator!=((IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                                 *)local_d8,
                                (IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                                 *)local_f8), bVar1) {
      schema_00 = _::
                  IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                  ::operator*((IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                               *)local_d8);
      getTransitiveSuperclasses(this,schema_00,local_20);
      _::IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>::
      operator++((IndexingIterator<const_capnp::InterfaceSchema::SuperclassList,_capnp::InterfaceSchema>
                  *)local_d8);
    }
  }
  return;
}

Assistant:

void getTransitiveSuperclasses(InterfaceSchema schema, std::map<uint64_t, InterfaceSchema>& map) {
    if (map.insert(std::make_pair(schema.getProto().getId(), schema)).second) {
      for (auto sup: schema.getSuperclasses()) {
        getTransitiveSuperclasses(sup, map);
      }
    }
  }